

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alldiff.h
# Opt level: O2

void __thiscall
mp::
AllDiffConverter_MIP<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
::ConvertCtxPos(AllDiffConverter_MIP<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                *this,ItemType_conflict3 *alld,int param_2)

{
  CustomConstraintData<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::AllDiffId>
  *va;
  double *pdVar1;
  FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  *pFVar2;
  FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>
  *this_00;
  int iVar3;
  Var VVar4;
  long lVar5;
  long lVar6;
  Error *this_01;
  ulong uVar7;
  double dVar8;
  double dVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  initializer_list<double> __l;
  initializer_list<int> __l_00;
  allocator_type local_3d2;
  allocator_type local_3d1;
  AlgConRhs<0> local_3d0;
  int local_3c4;
  int local_3c0;
  int local_3bc;
  AllDiffConverter_MIP<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  *local_3b8;
  vector<int,_std::allocator<int>_> flags;
  double local_388;
  vector<double,_std::allocator<double>_> coefs;
  AlgConRhs<_1> local_368;
  _Vector_base<double,_std::allocator<double>_> local_358;
  _Vector_base<int,_std::allocator<int>_> local_340;
  CustomFunctionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_>,_std::array<int,_0UL>,_mp::LogicalFunctionalConstraintTraits,_mp::CondConId<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_>_>_>
  local_328;
  LinTerms local_258;
  LinTerms local_1e0;
  AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_> local_168;
  AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_> local_c8;
  
  va = &alld->
        super_CustomConstraintData<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::AllDiffId>
  ;
  dVar8 = FlatModel<mp::DefaultFlatModelParams>::lb_array<std::vector<int,std::allocator<int>>>
                    ((FlatModel<mp::DefaultFlatModelParams> *)
                     (this->
                     super_BasicFuncConstrCvt<mp::AllDiffConverter_MIP<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                     ).
                     super_BasicItemConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                     .mdl_cvt_,&va->args_);
  local_3b8 = this;
  dVar9 = FlatModel<mp::DefaultFlatModelParams>::ub_array<std::vector<int,std::allocator<int>>>
                    ((FlatModel<mp::DefaultFlatModelParams> *)
                     (this->
                     super_BasicFuncConstrCvt<mp::AllDiffConverter_MIP<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                     ).
                     super_BasicItemConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                     .mdl_cvt_,&va->args_);
  if ((dVar8 <= -INFINITY) || (INFINITY <= dVar9)) {
    this_01 = (Error *)__cxa_allocate_exception(0x18);
    Error::Error(this_01,(CStringRef)0x2af03b,-1);
  }
  else {
    if ((-2147483648.0 <= dVar8) && (dVar9 <= 2147483647.0)) {
      local_3d0.rhs_ = round(dVar8);
      dVar9 = round(dVar9);
      local_328.super_FunctionalConstraint.super_BasicConstraint.name_._M_dataplus._M_p =
           (pointer)0x3ff0000000000000;
      std::vector<double,_std::allocator<double>_>::vector
                (&coefs,(long)(alld->
                              super_CustomConstraintData<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::AllDiffId>
                              ).args_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                        (long)(alld->
                              super_CustomConstraintData<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::AllDiffId>
                              ).args_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start >> 2,
                 (value_type_conflict *)&local_328,(allocator_type *)&flags);
      std::vector<int,_std::allocator<int>_>::vector
                (&flags,(long)(alld->
                              super_CustomConstraintData<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::AllDiffId>
                              ).args_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                        (long)(alld->
                              super_CustomConstraintData<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::AllDiffId>
                              ).args_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start >> 2,(allocator_type *)&local_328);
      pFVar2 = (local_3b8->
               super_BasicFuncConstrCvt<mp::AllDiffConverter_MIP<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
               ).
               super_BasicItemConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
               .mdl_cvt_;
      iVar3 = (alld->super_FunctionalConstraint).result_var_;
      dVar8 = (pFVar2->
              super_MIPFlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
              ).
              super_FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
              .super_FlatModel<mp::DefaultFlatModelParams>.var_lb_.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start[iVar3];
      pdVar1 = (pFVar2->
               super_MIPFlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
               ).
               super_FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
               .super_FlatModel<mp::DefaultFlatModelParams>.var_ub_.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start + iVar3;
      if ((dVar8 != *pdVar1) || (NAN(dVar8) || NAN(*pdVar1))) {
        lVar5 = (long)(alld->
                      super_CustomConstraintData<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::AllDiffId>
                      ).args_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)(alld->
                      super_CustomConstraintData<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::AllDiffId>
                      ).args_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start;
        lVar6 = lVar5 >> 2;
        auVar10._8_4_ = (int)(lVar5 >> 0x22);
        auVar10._0_8_ = lVar6;
        auVar10._12_4_ = 0x45300000;
        local_328.super_FunctionalConstraint.super_BasicConstraint.name_._M_dataplus._M_p =
             (pointer)((auVar10._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)lVar6) - 4503599627370496.0) + -1.0);
        std::vector<double,_std::allocator<double>_>::emplace_back<double>
                  (&coefs,(double *)&local_328);
        local_328.super_FunctionalConstraint.super_BasicConstraint.name_._M_dataplus._M_p._0_4_ =
             (alld->super_FunctionalConstraint).result_var_;
        std::vector<int,_std::allocator<int>_>::emplace_back<int>(&flags,(int *)&local_328);
        lVar5 = (long)(alld->
                      super_CustomConstraintData<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::AllDiffId>
                      ).args_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)(alld->
                      super_CustomConstraintData<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::AllDiffId>
                      ).args_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start;
        lVar6 = lVar5 >> 2;
        auVar11._8_4_ = (int)(lVar5 >> 0x22);
        auVar11._0_8_ = lVar6;
        auVar11._12_4_ = 0x45300000;
        local_368.rhs_ =
             (auVar11._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)lVar6) - 4503599627370496.0);
      }
      else {
        local_368.rhs_ = 1.0;
      }
      local_3c4 = (int)dVar9 + 1;
      iVar3 = (int)local_3d0.rhs_;
      while (iVar3 != local_3c4) {
        local_3d0.rhs_ = (double)iVar3;
        local_3c0 = iVar3;
        for (uVar7 = 0;
            this_00 = (FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>
                       *)(local_3b8->
                         super_BasicFuncConstrCvt<mp::AllDiffConverter_MIP<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                         ).
                         super_BasicItemConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                         .mdl_cvt_,
            uVar7 < (ulong)((long)(alld->
                                  super_CustomConstraintData<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::AllDiffId>
                                  ).args_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_finish -
                            (long)(alld->
                                  super_CustomConstraintData<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::AllDiffId>
                                  ).args_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start >> 2); uVar7 = uVar7 + 1) {
          local_388 = 1.0;
          __l._M_len = 1;
          __l._M_array = &local_388;
          std::vector<double,_std::allocator<double>_>::vector
                    ((vector<double,_std::allocator<double>_> *)&local_358,__l,&local_3d1);
          local_3bc = (va->args_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start[uVar7];
          __l_00._M_len = 1;
          __l_00._M_array = &local_3bc;
          std::vector<int,_std::allocator<int>_>::vector
                    ((vector<int,_std::allocator<int>_> *)&local_340,__l_00,&local_3d2);
          LinTerms::LinTerms(&local_1e0,(vector<double,_std::allocator<double>_> *)&local_358,
                             (vector<int,_std::allocator<int>_> *)&local_340);
          AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_>::AlgebraicConstraint
                    (&local_c8,&local_1e0,local_3d0,true);
          ConditionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_>_>::
          ConditionalConstraint
                    ((ConditionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_>_>
                      *)&local_328,&local_c8);
          VVar4 = FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>
                  ::
                  AssignResultVar2Args<mp::ConditionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,mp::AlgConRhs<0>>>>
                            (this_00,(ConditionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_>_>
                                      *)&local_328);
          flags.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[uVar7] = VVar4;
          CustomFunctionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_>,_std::array<int,_0UL>,_mp::LogicalFunctionalConstraintTraits,_mp::CondConId<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_>_>_>
          ::~CustomFunctionalConstraint(&local_328);
          AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_>::~AlgebraicConstraint(&local_c8);
          LinTerms::~LinTerms(&local_1e0);
          std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_340);
          std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_358);
        }
        LinTerms::LinTerms(&local_258,&coefs,&flags);
        AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<-1>_>::AlgebraicConstraint
                  (&local_168,&local_258,local_368,true);
        FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>
        ::AddConstraint<mp::AlgebraicConstraint<mp::LinTerms,mp::AlgConRhs<_1>>>(this_00,&local_168)
        ;
        AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<-1>_>::~AlgebraicConstraint(&local_168);
        LinTerms::~LinTerms(&local_258);
        iVar3 = local_3c0 + 1;
      }
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&flags.super__Vector_base<int,_std::allocator<int>_>);
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                (&coefs.super__Vector_base<double,_std::allocator<double>_>);
      return;
    }
    this_01 = (Error *)__cxa_allocate_exception(0x18);
    Error::Error(this_01,(CStringRef)0x2af072,-1);
  }
  __cxa_throw(this_01,&Error::typeinfo,fmt::SystemError::~SystemError);
}

Assistant:

void ConvertCtxPos(const ItemType& alld, int ) {
    const auto& args = alld.GetArguments();
    const auto lba_dbl = GetMC().lb_array(args);
    const auto uba_dbl = GetMC().ub_array(args);
    if (lba_dbl<=GetMC().MinusInfty() ||
        uba_dbl>=GetMC().Infty())
      MP_RAISE("MP2MIP: AllDiff on unbounded variables not implemented");
    if (lba_dbl<std::numeric_limits<int>::min() ||
        uba_dbl>std::numeric_limits<int>::max())
      MP_RAISE("MP2MIP: AllDiff on variables with domain "
               "out of integer range not implemented");
    const int lba = (int)std::round(lba_dbl);
    const int uba = (int)std::round(uba_dbl);
    std::vector<double> coefs(args.size(), 1.0);
    std::vector<int> flags(args.size());        // unary encoding flags
    double rhs = 1.0;
    if (!GetMC().is_fixed(alld.GetResultVar())) {  // implied version: b -> alldiff
      coefs.push_back(args.size()-1.0);
      flags.push_back(alld.GetResultVar());
      rhs = (double)args.size();
    }
    for (int v=lba; v!=uba+1; ++v) {            // for each value in the domain union
      for (size_t ivar = 0; ivar < args.size(); ++ivar) {
        flags[ivar] = GetMC().AssignResultVar2Args(
              CondLinConEQ( { {{1.0}, {args[ivar]}}, double(v) } ) );
      }
      GetMC().AddConstraint( LinConLE( {coefs, flags}, {rhs} ) );
    }
  }